

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# work_queue.h
# Opt level: O3

bool __thiscall
WorkQueue<CMU462::WorkItem>::try_get_work(WorkQueue<CMU462::WorkItem> *this,WorkItem *outPtr)

{
  pointer __src;
  pointer pWVar1;
  pointer pWVar2;
  pointer __dest;
  int iVar3;
  int iVar4;
  int iVar5;
  pointer pWVar6;
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->lock);
  if (iVar5 == 0) {
    pWVar1 = (this->storage).super__Vector_base<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pWVar2 = (this->storage).super__Vector_base<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (pWVar1 != pWVar2) {
      iVar5 = pWVar1->tile_y;
      iVar3 = pWVar1->tile_w;
      iVar4 = pWVar1->tile_h;
      outPtr->tile_x = pWVar1->tile_x;
      outPtr->tile_y = iVar5;
      outPtr->tile_w = iVar3;
      outPtr->tile_h = iVar4;
      __dest = (this->storage).
               super__Vector_base<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>._M_impl.
               super__Vector_impl_data._M_start;
      pWVar6 = (this->storage).
               super__Vector_base<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>._M_impl.
               super__Vector_impl_data._M_finish;
      __src = __dest + 1;
      if (__src != pWVar6) {
        memmove(__dest,__src,(long)pWVar6 - (long)__src);
        pWVar6 = (this->storage).
                 super__Vector_base<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      (this->storage).super__Vector_base<CMU462::WorkItem,_std::allocator<CMU462::WorkItem>_>.
      _M_impl.super__Vector_impl_data._M_finish = pWVar6 + -1;
    }
    pthread_mutex_unlock((pthread_mutex_t *)&this->lock);
    return pWVar1 != pWVar2;
  }
  std::__throw_system_error(iVar5);
}

Assistant:

bool try_get_work(T *outPtr) {
      lock.lock();
      if (storage.empty()) {
        lock.unlock();
        return false;
      }
      *outPtr = storage.front();
      storage.erase(storage.begin());
      lock.unlock();
      return true;
    }